

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Cluster::CreateSimpleBlock(Cluster *this,longlong st,longlong sz)

{
  BlockEntry **ppBVar1;
  ulong uVar2;
  SimpleBlock *this_00;
  long lVar3;
  
  ppBVar1 = this->m_entries;
  if (ppBVar1 == (BlockEntry **)0x0) {
    __assert_fail("m_entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c7c,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  if (this->m_entries_size < 1) {
    __assert_fail("m_entries_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c7d,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  uVar2 = this->m_entries_count;
  if ((long)uVar2 < 0) {
    __assert_fail("m_entries_count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1c7e,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
  }
  if (uVar2 < (ulong)this->m_entries_size) {
    this_00 = (SimpleBlock *)operator_new(0x50,(nothrow_t *)&std::nothrow);
    if (this_00 == (SimpleBlock *)0x0) {
      ppBVar1[uVar2] = (BlockEntry *)0x0;
      lVar3 = -1;
    }
    else {
      (this_00->super_BlockEntry).m_pCluster = this;
      (this_00->super_BlockEntry).m_index = uVar2;
      (this_00->super_BlockEntry)._vptr_BlockEntry = (_func_int **)&PTR__SimpleBlock_0013fc38;
      (this_00->m_block).m_start = st;
      (this_00->m_block).m_size = sz;
      (this_00->m_block).m_track = 0;
      (this_00->m_block).m_timecode = -1;
      (this_00->m_block).m_flags = '\0';
      (this_00->m_block).m_frames = (Frame *)0x0;
      (this_00->m_block).m_frame_count = -1;
      (this_00->m_block).m_discard_padding = 0;
      ppBVar1[uVar2] = (BlockEntry *)this_00;
      lVar3 = SimpleBlock::Parse(this_00);
      if (lVar3 == 0) {
        this->m_entries_count = this->m_entries_count + 1;
        lVar3 = 0;
      }
      else {
        if (ppBVar1[uVar2] != (BlockEntry *)0x0) {
          (*ppBVar1[uVar2]->_vptr_BlockEntry[1])();
        }
        ppBVar1[uVar2] = (BlockEntry *)0x0;
      }
    }
    return lVar3;
  }
  __assert_fail("m_entries_count < m_entries_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1c7f,"long mkvparser::Cluster::CreateSimpleBlock(long long, long long)");
}

Assistant:

long Cluster::CreateSimpleBlock(long long st, long long sz) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow) SimpleBlock(this, idx, st, sz);

  if (pEntry == NULL)
    return -1;  // generic error

  SimpleBlock* const p = static_cast<SimpleBlock*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}